

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

pair<llvm::DenseMapIterator<unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>,_false>,_bool>
* __thiscall
llvm::
DenseMapBase<llvm::SmallDenseMap<unsigned_short,llvm::detail::DenseSetEmpty,4u,llvm::DenseMapInfo<unsigned_short>,llvm::detail::DenseSetPair<unsigned_short>>,unsigned_short,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<unsigned_short>,llvm::detail::DenseSetPair<unsigned_short>>
::try_emplace<llvm::detail::DenseSetEmpty&>
          (pair<llvm::DenseMapIterator<unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>,_false>,_bool>
           *__return_storage_ptr__,void *this,unsigned_short *Key,DenseSetEmpty *Args)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  DenseSetPair<unsigned_short> *local_30;
  DenseSetPair<unsigned_short> *ConstFoundBucket;
  
  bVar1 = DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
          ::LookupBucketFor<unsigned_short>
                    ((DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                      *)this,Key,&local_30);
  if (!bVar1) {
    local_30 = DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
               ::InsertIntoBucketImpl<unsigned_short>
                         ((DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                           *)this,Key,Key,local_30);
    local_30->key = *Key;
  }
  bVar4 = (*this & 1) == 0;
  lVar2 = (long)this + 8;
  if (bVar4) {
    lVar2 = *(long *)((long)this + 8);
  }
  uVar3 = 4;
  if (bVar4) {
    uVar3 = (ulong)*(uint *)((long)this + 0x10);
  }
  (__return_storage_ptr__->first).Ptr = local_30;
  (__return_storage_ptr__->first).End = (pointer)(lVar2 + uVar3 * 2);
  __return_storage_ptr__->second = !bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace(KeyT &&Key, Ts &&... Args) {
    BucketT *TheBucket;
    if (LookupBucketFor(Key, TheBucket))
      return std::make_pair(
               makeIterator(TheBucket, getBucketsEnd(), *this, true),
               false); // Already in map.

    // Otherwise, insert the new element.
    TheBucket =
        InsertIntoBucket(TheBucket, std::move(Key), std::forward<Ts>(Args)...);
    return std::make_pair(
             makeIterator(TheBucket, getBucketsEnd(), *this, true),
             true);
  }